

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangulator.c
# Opt level: O3

_Bool al_triangulate_polygon
                (float *vertices,size_t vertex_stride,int *vertex_counts,
                _func_void_int_int_int_void_ptr *emit_triangle,void *userdata)

{
  int iVar1;
  void *pvVar2;
  _Bool _Var3;
  char cVar4;
  int iVar5;
  int *__ptr;
  _AL_LIST *vertices_00;
  _AL_LIST *reflex;
  _AL_LIST *ear;
  _AL_LIST *p_Var6;
  long lVar7;
  _AL_LIST_ITEM *p_Var8;
  int *piVar9;
  _AL_LIST_ITEM *p_Var10;
  float *pfVar11;
  float *p1;
  ulong uVar12;
  float *pfVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  int iVar16;
  _AL_LIST *reflex_00;
  ulong uVar17;
  float *v0;
  long lVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  _AL_LIST_ITEM *p_Var22;
  long lVar23;
  bool bVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float t1;
  float t0;
  float v1 [2];
  float intersection [2];
  _AL_LIST_ITEM *local_d8;
  _AL_LIST_ITEM *local_b0;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  void *local_68;
  _func_void_int_int_int_void_ptr *local_60;
  float local_58;
  undefined4 uStack_54;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar19 = 0xffffffffffffffff;
  lVar23 = 4;
  lVar18 = -0x20;
  lVar21 = 4;
  do {
    lVar21 = lVar21 + -4;
    lVar23 = lVar23 + -2;
    lVar18 = lVar18 + 0x20;
    lVar7 = uVar19 + 1;
    uVar19 = uVar19 + 1;
  } while (0 < vertex_counts[lVar7]);
  __ptr = (int *)malloc(-lVar21);
  if (__ptr == (int *)0x0) {
    return false;
  }
  lVar21 = 0;
  if (uVar19 != 0) {
    uVar17 = 0;
    do {
      lVar21 = (long)(int)lVar21 + (long)vertex_counts[uVar17];
      __ptr[uVar17] = (int)lVar21;
      uVar17 = uVar17 + 1;
    } while (uVar19 != uVar17);
  }
  lVar21 = lVar21 - lVar23;
  local_68 = userdata;
  vertices_00 = (_AL_LIST *)_al_list_create_static(lVar21);
  reflex = (_AL_LIST *)_al_list_create_static(lVar21);
  ear = (_AL_LIST *)_al_list_create_static(lVar21);
  local_60 = emit_triangle;
  if (1 < uVar19) {
    p_Var6 = (_AL_LIST *)_al_list_create_static(uVar19);
    lVar18 = al_malloc_with_context
                       (lVar18,0x112,
                        "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/primitives/triangulator.c"
                        ,"poly_create_split_list");
    if (lVar18 != 0 && p_Var6 != (_AL_LIST *)0x0) {
      _al_list_set_dtor(p_Var6,poly_split_list_dtor);
      _al_list_set_user_data(p_Var6);
      uVar17 = 1;
      iVar5 = *__ptr;
      do {
        lVar23 = uVar17 * 0x20;
        lVar21 = lVar18 + lVar23;
        *(int *)(lVar18 + lVar23) = iVar5;
        iVar1 = __ptr[uVar17];
        iVar16 = -1;
        fVar26 = -3.4028235e+38;
        *(long *)(lVar18 + 8 + lVar23) = (long)(iVar1 - iVar5);
        if (iVar1 - iVar5 != 0 && iVar5 <= iVar1) {
          lVar23 = (long)iVar1 - (long)iVar5;
          pfVar13 = (float *)((long)iVar5 * vertex_stride + (long)vertices);
          fVar26 = -3.4028235e+38;
          iVar20 = iVar5;
          iVar16 = -1;
          do {
            fVar25 = *pfVar13;
            if (fVar26 <= fVar25) {
              *(float **)(lVar21 + 0x10) = pfVar13;
              *(int *)(lVar21 + 0x18) = iVar20;
              fVar26 = fVar25;
              iVar16 = iVar20;
            }
            iVar20 = iVar20 + 1;
            pfVar13 = (float *)((long)pfVar13 + vertex_stride);
            lVar23 = lVar23 + -1;
          } while (lVar23 != 0);
        }
        *(int *)(lVar21 + 0x18) = iVar16 - iVar5;
        cVar4 = _al_list_is_empty(p_Var6);
        if (cVar4 == '\0') {
          for (lVar23 = _al_list_front(p_Var6); lVar23 != 0; lVar23 = _al_list_next(p_Var6,lVar23))
          {
            lVar7 = _al_list_item_data(lVar23);
            if (**(float **)(lVar7 + 0x10) <= fVar26 && fVar26 != **(float **)(lVar7 + 0x10)) {
              _al_list_insert_before(p_Var6,lVar23,lVar21);
              goto LAB_0010def1;
            }
          }
        }
        _al_list_push_back(p_Var6,lVar21);
LAB_0010def1:
        uVar17 = uVar17 + 1;
        iVar5 = iVar1;
      } while (uVar19 != uVar17);
      goto LAB_0010df26;
    }
    _al_list_destroy();
    al_free_with_context
              (lVar18,0x117,
               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/primitives/triangulator.c"
               ,"poly_create_split_list");
  }
  p_Var6 = (_AL_LIST *)0x0;
LAB_0010df26:
  bVar24 = ear != (_AL_LIST *)0x0;
  if (((p_Var6 != (_AL_LIST *)0x0 || uVar19 < 2) && bVar24) &&
      (reflex != (_AL_LIST *)0x0 && vertices_00 != (_AL_LIST *)0x0)) {
    lVar18 = (long)*__ptr;
    if (0 < lVar18) {
      do {
        _al_list_push_back(vertices_00);
        lVar18 = lVar18 + -1;
      } while (lVar18 != 0);
    }
    p_Var8 = (_AL_LIST_ITEM *)_al_list_front(vertices_00);
    reflex_00 = reflex;
    if (1 < uVar19) {
      poly_classify_vertices_in_range
                (p_Var8,(_AL_LIST_ITEM *)0x0,vertices_00,reflex,(_AL_LIST *)0x0);
      lVar18 = _al_list_front(p_Var6);
      while (lVar18 != 0) {
        piVar9 = (int *)_al_list_item_data(lVar18);
        pfVar13 = *(float **)(piVar9 + 4);
        local_70 = *pfVar13 + 1.0;
        local_6c = pfVar13[1];
        p_Var10 = (_AL_LIST_ITEM *)_al_list_front(vertices_00);
        p_Var8 = (_AL_LIST_ITEM *)_al_list_next_circular(vertices_00);
        lVar18 = _al_list_size(vertices_00);
        if (lVar18 == 0) break;
        local_48 = 0;
        uStack_40 = 0;
        uVar17 = 0;
        local_b0 = (_AL_LIST_ITEM *)0x0;
        local_d8 = (_AL_LIST_ITEM *)0x0;
        fVar26 = 3.4028235e+38;
        do {
          p_Var22 = p_Var8;
          pfVar11 = (float *)_al_list_item_data(p_Var10);
          p1 = (float *)_al_list_item_data(p_Var22);
          if ((((p1[1] < pfVar11[1] || p1[1] == pfVar11[1]) &&
               ((((*pfVar13 < *pfVar11 || (*pfVar13 < *p1)) &&
                 (_Var3 = _al_prim_intersect_segment
                                    (pfVar13,&local_70,pfVar11,p1,(float *)&local_50,&local_74,
                                     &local_78), _Var3)) && ((0.0 <= local_78 && (local_78 <= 1.0)))
                ))) && (0.0 <= local_74)) && (local_74 < fVar26)) {
            local_48 = local_50;
            uStack_40 = 0;
            local_d8 = p_Var10;
            local_b0 = p_Var22;
            fVar26 = local_74;
          }
          uVar17 = uVar17 + 1;
          p_Var8 = (_AL_LIST_ITEM *)_al_list_next_circular(vertices_00);
          uVar12 = _al_list_size(vertices_00);
          p_Var10 = p_Var22;
        } while (uVar17 < uVar12);
        if (local_d8 == (_AL_LIST_ITEM *)0x0) break;
        local_58 = (float)local_48;
        uStack_54 = local_48._4_4_;
        pfVar11 = (float *)_al_list_item_data();
        pfVar13 = (float *)_al_list_item_data(local_b0);
        _Var3 = _al_prim_are_points_equal(*(float **)(piVar9 + 4),pfVar11);
        if (!_Var3) {
          _Var3 = _al_prim_are_points_equal(*(float **)(piVar9 + 4),pfVar13);
          local_b0 = local_b0;
          if (!_Var3) {
            if (*pfVar13 <= *pfVar11 && *pfVar11 != *pfVar13) {
              local_b0 = local_d8;
              pfVar13 = pfVar11;
            }
            lVar18 = _al_list_front(reflex);
            if (lVar18 == 0) {
              p_Var8 = (_AL_LIST_ITEM *)0x0;
            }
            else {
              p_Var8 = (_AL_LIST_ITEM *)0x0;
              fVar26 = 3.4028235e+38;
              do {
                p_Var10 = (_AL_LIST_ITEM *)_al_list_item_data(lVar18);
                pfVar11 = (float *)_al_list_item_data(p_Var10);
                _Var3 = _al_prim_is_point_in_triangle
                                  (pfVar11,*(float **)(piVar9 + 4),pfVar13,&local_58);
                if ((_Var3) &&
                   (fVar25 = *pfVar11 - **(float **)(piVar9 + 4),
                   fVar27 = pfVar11[1] - (*(float **)(piVar9 + 4))[1],
                   fVar25 = fVar25 * fVar25 + fVar27 * fVar27, fVar25 < fVar26)) {
                  p_Var8 = p_Var10;
                  fVar26 = fVar25;
                }
                lVar18 = _al_list_next(reflex);
              } while (lVar18 != 0);
            }
            if (p_Var8 != (_AL_LIST_ITEM *)0x0) {
              local_b0 = p_Var8;
            }
          }
          local_d8 = local_b0;
          if (local_d8 == (_AL_LIST_ITEM *)0x0) break;
        }
        uVar17 = *(ulong *)(piVar9 + 2);
        uVar12 = 0;
        p_Var8 = local_d8;
        do {
          p_Var8 = (_AL_LIST_ITEM *)
                   _al_list_insert_after
                             (vertices_00,p_Var8,
                              (float *)((((long)piVar9[6] + uVar12) % uVar17 + (long)*piVar9) *
                                        vertex_stride + (long)vertices));
          uVar12 = uVar12 + 1;
          uVar17 = *(ulong *)(piVar9 + 2);
        } while (uVar12 <= uVar17);
        uVar14 = _al_list_item_data(local_d8);
        uVar14 = _al_list_insert_after(vertices_00,p_Var8,uVar14);
        _al_list_remove(reflex,local_d8);
        p_Var8 = (_AL_LIST_ITEM *)_al_list_next(vertices_00,uVar14);
        poly_classify_vertices_in_range(local_d8,p_Var8,vertices_00,reflex,(_AL_LIST *)0x0);
        lVar18 = _al_list_next(p_Var6);
      }
      _al_list_destroy(p_Var6);
      p_Var8 = (_AL_LIST_ITEM *)_al_list_front(vertices_00);
      reflex_00 = (_AL_LIST *)0x0;
    }
    poly_classify_vertices_in_range(p_Var8,(_AL_LIST_ITEM *)0x0,vertices_00,reflex_00,ear);
    cVar4 = _al_list_is_empty(ear);
    pvVar2 = local_68;
    while (cVar4 == '\0') {
      uVar14 = _al_list_front(ear);
      uVar15 = _al_list_item_data(uVar14);
      p_Var8 = (_AL_LIST_ITEM *)_al_list_previous_circular(vertices_00,uVar15);
      p_Var10 = (_AL_LIST_ITEM *)_al_list_next_circular(vertices_00,uVar15);
      lVar18 = _al_list_item_data(p_Var8);
      lVar21 = _al_list_item_data(uVar15);
      lVar23 = _al_list_item_data(p_Var10);
      (*local_60)((int)((ulong)(lVar18 - (long)vertices) / vertex_stride),
                  (int)((ulong)(lVar21 - (long)vertices) / vertex_stride),
                  (int)((ulong)(lVar23 - (long)vertices) / vertex_stride),pvVar2);
      _al_list_erase(ear,uVar14);
      _al_list_erase(vertices_00,uVar15);
      uVar14 = _al_list_find_first(reflex,uVar15);
      _al_list_erase(reflex,uVar14);
      poly_update_vertex_attributes(vertices_00,reflex,ear,p_Var8);
      poly_update_vertex_attributes(vertices_00,reflex,ear,p_Var10);
      cVar4 = _al_list_is_empty(ear);
    }
    _al_list_destroy(vertices_00);
    _al_list_destroy(reflex);
  }
  else {
    _al_list_destroy(vertices_00);
    _al_list_destroy(reflex);
    _al_list_destroy(ear);
    ear = p_Var6;
  }
  _al_list_destroy(ear);
  free(__ptr);
  return ((p_Var6 != (_AL_LIST *)0x0 || uVar19 < 2) && bVar24) &&
         (reflex != (_AL_LIST *)0x0 && vertices_00 != (_AL_LIST *)0x0);
}

Assistant:

bool al_triangulate_polygon(
   const float* vertices, size_t vertex_stride, const int* vertex_counts,
   void (*emit_triangle)(int, int, int, void*), void* userdata)
{
   POLY polygon;
   int vertex_count;
   int split_count;
   int *splits;
   int i;
   bool ret;

   for (i = 0; vertex_counts[i] > 0; i++) {
      /* do nothing */
   }
   ASSERT(i > 0);
   split_count = i;

   splits = malloc(split_count * sizeof(int));
   if (!splits) {
      return false;
   }
   vertex_count = 0;
   for (i = 0; i < split_count; i++) {
      vertex_count += vertex_counts[i];
      splits[i] = vertex_count;
   }

   memset(&polygon, 0, sizeof(polygon));
   polygon.vertex_buffer = vertices;
   polygon.vertex_stride = vertex_stride;
   polygon.vertex_count  = vertex_count;
   polygon.split_indices = splits;
   polygon.split_stride  = sizeof(int);   /* XXX can simplify code now */
   polygon.split_count   = split_count;
   polygon.emit          = emit_triangle;
   polygon.userdata      = userdata;

   if (poly_initialize(&polygon)) {

      poly_do_triangulate(&polygon);

      _al_list_destroy(polygon.vertex_list);
      _al_list_destroy(polygon.reflex_list);
      _al_list_destroy(polygon.ear_list);

      ret = true;
   }
   else {
      ret = false;
   }

   free(splits);

   return ret;
}